

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::insert_item<Map::Pair<std::__cxx11::string,Table>>
               (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
                *data,size_t pos,size_t *size,
               Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
               *entry)

{
  ulong index;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
  *pPVar4;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
  *pPVar5;
  
  index = *size;
  *size = index + 1;
  while (pos < index) {
    pPVar4 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             ::operator[](data,index - 1);
    pPVar5 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             ::operator[](data,index);
    std::__cxx11::string::_M_assign((string *)pPVar5);
    std::__cxx11::string::_M_assign((string *)&pPVar5->value);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(pPVar5->value).columns,&(pPVar4->value).columns);
    BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::operator=(&(pPVar5->value).column_map.tree,&(pPVar4->value).column_map.tree);
    BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator=((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)&(pPVar5->value).index,
                (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)&(pPVar4->value).index);
    pcVar1 = (pPVar4->value).MAX_FIELD_EXCEEDED;
    pcVar2 = (pPVar4->value).MAX_FIELD_SIZE_EXCEEDED;
    pcVar3 = (pPVar4->value).MISMATCHED_COL_NUM;
    (pPVar5->value).CANNOT_FIND_TABLE = (pPVar4->value).CANNOT_FIND_TABLE;
    (pPVar5->value).MAX_FIELD_EXCEEDED = pcVar1;
    (pPVar5->value).MAX_FIELD_SIZE_EXCEEDED = pcVar2;
    (pPVar5->value).MISMATCHED_COL_NUM = pcVar3;
    (pPVar5->value).INVALID_NAME = (pPVar4->value).INVALID_NAME;
    index = index - 1;
  }
  pPVar4 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
           ::operator[](data,pos);
  std::__cxx11::string::_M_assign((string *)pPVar4);
  std::__cxx11::string::_M_assign((string *)&pPVar4->value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(pPVar4->value).columns,&(entry->value).columns);
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::operator=(&(pPVar4->value).column_map.tree,&(entry->value).column_map.tree);
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::operator=((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)&(pPVar4->value).index,
              (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)&(entry->value).index);
  pcVar1 = (entry->value).MAX_FIELD_EXCEEDED;
  pcVar2 = (entry->value).MAX_FIELD_SIZE_EXCEEDED;
  pcVar3 = (entry->value).MISMATCHED_COL_NUM;
  (pPVar4->value).CANNOT_FIND_TABLE = (entry->value).CANNOT_FIND_TABLE;
  (pPVar4->value).MAX_FIELD_EXCEEDED = pcVar1;
  (pPVar4->value).MAX_FIELD_SIZE_EXCEEDED = pcVar2;
  (pPVar4->value).MISMATCHED_COL_NUM = pcVar3;
  (pPVar4->value).INVALID_NAME = (entry->value).INVALID_NAME;
  return;
}

Assistant:

void insert_item(b_array::Array<T>& data, size_t pos, size_t& size, const T& entry) {
    for (size_t i = size++; i > pos; i--) {
        data[i] = data[i - 1];
    }
    data[pos] = entry;
}